

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O2

void __thiscall gimage::ImageIO::load(ImageIO *this,ImageU8 *image,uint8 *data,size_t length)

{
  int iVar1;
  IOException *this_00;
  pointer ppBVar2;
  allocator local_51;
  string local_50;
  
  ppBVar2 = (this->list).
            super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if ((this->list).
        super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>._M_impl.
        super__Vector_impl_data._M_finish <= ppBVar2) {
      this_00 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_50,"Loading images from memory is not implemented",&local_51);
      gutil::IOException::IOException(this_00,&local_50);
      __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    iVar1 = (*(*ppBVar2)->_vptr_BasicImageIO[0xd])(*ppBVar2,data,length);
    if ((char)iVar1 != '\0') break;
    ppBVar2 = ppBVar2 + 1;
  }
  (*(*ppBVar2)->_vptr_BasicImageIO[0xe])(*ppBVar2,image,data,length);
  return;
}

Assistant:

void ImageIO::load(ImageU8 &image, gutil::uint8 *data, size_t length)
{
  for (std::vector<BasicImageIO *>::const_iterator it=list.begin(); it<list.end(); ++it)
  {
    if ((*it)->handles(data, length))
    {
      (*it)->load(image, data, length);
      return;
    }
  }

  throw gutil::IOException("Loading images from memory is not implemented");
}